

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playmidi.cpp
# Opt level: O2

void __thiscall Timidity::Renderer::drop_sustain(Renderer *this,int chan)

{
  int i;
  long lVar1;
  long lVar2;
  bool bVar3;
  
  i = this->voices;
  lVar2 = (long)i;
  lVar1 = lVar2 * 0x170 + -0x16f;
  while( true ) {
    i = i + -1;
    bVar3 = lVar2 == 0;
    lVar2 = lVar2 + -1;
    if (bVar3) break;
    if (((uint)(&this->voice->status)[lVar1] == chan) &&
       ((*(byte *)((long)this->voice + lVar1 + -1) & 0x20) != 0)) {
      finish_note(this,i);
    }
    lVar1 = lVar1 + -0x170;
  }
  return;
}

Assistant:

void Renderer::drop_sustain(int chan)
{
	int i = voices;
	while (i--)
	{
		if (voice[i].channel == chan && (voice[i].status & NOTE_SUSTAIN))
		{
			finish_note(i);
		}
	}
}